

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bfins_32_d(void)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  sbyte sVar7;
  uint local_60;
  uint local_50;
  uint local_48;
  uint local_38;
  uint64 insert;
  uint64 mask;
  uint *data;
  uint local_10;
  uint width;
  uint offset;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    data._4_4_ = m68ki_read_imm_16();
    local_10 = data._4_4_ >> 6 & 0x1f;
    puVar4 = m68ki_cpu.dar + (m68ki_cpu.ir & 7);
    uVar2 = data._4_4_ >> 0xc;
    if ((data._4_4_ & 0x800) != 0) {
      local_10 = m68ki_cpu.dar[data._4_4_ >> 6 & 7];
    }
    if ((data._4_4_ & 0x20) != 0) {
      data._4_4_ = m68ki_cpu.dar[data._4_4_ & 7];
    }
    uVar3 = local_10 & 0x1f;
    cVar1 = ((char)data._4_4_ - 1U & 0x1f) + 1;
    local_48 = -1 << (0x20U - cVar1 & 0x1f);
    sVar7 = (sbyte)uVar3;
    if (uVar3 < 0x20) {
      local_38 = local_48 >> sVar7;
    }
    else {
      local_38 = 0;
    }
    if (0x20 - uVar3 < 0x20) {
      local_48 = local_48 << (0x20U - sVar7 & 0x3f);
    }
    else {
      local_48 = 0;
    }
    uVar5 = (ulong)m68ki_cpu.dar[uVar2 & 7] << (0x20U - cVar1 & 0x3f);
    uVar6 = uVar5 & 0xffffffff;
    m68ki_cpu.n_flag = (uint)(uVar6 >> 0x18);
    m68ki_cpu.not_z_flag = (uint)uVar5;
    if (uVar3 < 0x20) {
      local_50 = (uint)(uVar6 >> sVar7);
    }
    else {
      local_50 = 0;
    }
    if (0x20 - uVar3 < 0x20) {
      local_60 = (uint)(uVar6 << (0x20U - sVar7 & 0x3f));
    }
    else {
      local_60 = 0;
    }
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    *puVar4 = *puVar4 & ((local_38 | local_48) ^ 0xffffffff);
    *puVar4 = *puVar4 | local_50 | local_60;
  }
  return;
}

Assistant:

static void m68k_op_bfins_32_d(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint offset = (word2>>6)&31;
		uint width = word2;
		uint* data = &DY;
		uint64 mask;
		uint64 insert = REG_D[(word2>>12)&7];


		if(BIT_B(word2))
			offset = REG_D[offset&7];
		if(BIT_5(word2))
			width = REG_D[width&7];


		offset &= 31;
		width = ((width-1) & 31) + 1;


		mask = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask = ROR_32(mask, offset);

		insert = MASK_OUT_ABOVE_32(insert << (32 - width));
		FLAG_N = NFLAG_32(insert);
		FLAG_Z = insert;
		insert = ROR_32(insert, offset);

		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		*data &= ~mask;
		*data |= insert;
		return;
	}
	m68ki_exception_illegal();
}